

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * String::fromHex(String *__return_storage_ptr__,byte *data,usize size)

{
  usize copyLength;
  char *pcVar1;
  byte *pbVar2;
  
  __return_storage_ptr__->data = &emptyData.super_Data;
  detach(__return_storage_ptr__,size * 2,size * 2);
  copyLength = __return_storage_ptr__->data->len;
  detach(__return_storage_ptr__,copyLength,copyLength);
  if (0 < (long)size) {
    pbVar2 = data + size;
    pcVar1 = __return_storage_ptr__->data->str;
    do {
      *pcVar1 = "0123456789ABCDEF"[*data >> 4];
      pcVar1[1] = "0123456789ABCDEF"[*data & 0xf];
      pcVar1 = pcVar1 + 2;
      data = data + 1;
    } while (data < pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String String::fromHex(const byte* data, usize size)
{
  String result;
  result.resize(size * 2);
  char* dest = result;
  const char* hex = "0123456789ABCDEF";
  for(const byte* src =  data, * end = data + size; src < end; ++src)
  {
    dest[0] = hex[*src >> 4];
    dest[1] = hex[*src & 0xf];
    dest += 2;
  }
  return result;
}